

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test7::getTessellationControlShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  _variable_type type;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  _variable_type type_00;
  uint local_40c;
  string local_408 [4];
  uint n_component;
  string local_3e8 [32];
  stringstream local_3c8 [8];
  stringstream array_index_sstream;
  ostream local_3b8;
  uint local_23c;
  undefined1 local_238 [4];
  uint index;
  string variable_type_string;
  uint n_variable_type_components;
  _variable_type variable_type;
  uint variable_array_size;
  uint n_variable;
  uint counter;
  size_t n_variables;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  _variables *local_20;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  
  local_20 = variables;
  variables_local = (_variables *)this;
  this_local = (GPUShaderFP64Test7 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(&local_198,"#version 400\n\nlayout (vertices=4) out;\nin VS_DATA\n{\n");
  getVariableDeclarations_abi_cxx11_(&local_1d8,this,"vs",local_20,"");
  poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"} in_data[];\nout TC_DATA\n{\n");
  getVariableDeclarations_abi_cxx11_((string *)&n_variables,this,"tc",local_20,"");
  poVar2 = std::operator<<(poVar2,(string *)&n_variables);
  std::operator<<(poVar2,
                  "} out_data[];\n\nvoid main()\n{\n    gl_TessLevelInner[0] = 1;\n    gl_TessLevelInner[1] = 1;\n    gl_TessLevelOuter[0] = 1;\n    gl_TessLevelOuter[1] = 1;\n    gl_TessLevelOuter[2] = 1;\n    gl_TessLevelOuter[3] = 1;\n\n"
                 );
  std::__cxx11::string::~string((string *)&n_variables);
  std::__cxx11::string::~string((string *)&local_1d8);
  sVar3 = std::
          vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
          ::size(local_20);
  variable_array_size = 2;
  for (variable_type = VARIABLE_TYPE_BOOL; variable_type < sVar3;
      variable_type = variable_type + VARIABLE_TYPE_BVEC2) {
    pvVar4 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[](local_20,(ulong)variable_type);
    uVar1 = pvVar4->array_size;
    pvVar4 = std::
             vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             ::operator[](local_20,(ulong)variable_type);
    type = pvVar4->type;
    variable_type_string.field_2._12_4_ = Utils::getNumberOfComponentsForVariableType(type);
    Utils::getVariableTypeString_abi_cxx11_((string *)local_238,(Utils *)(ulong)type,type_00);
    for (local_23c = 0; local_23c < uVar1; local_23c = local_23c + 1) {
      std::__cxx11::stringstream::stringstream(local_3c8);
      if (1 < uVar1) {
        poVar2 = std::operator<<(&local_3b8,"[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_23c);
        std::operator<<(poVar2,"]");
      }
      poVar2 = std::operator<<(&local_198,"out_data[gl_InvocationID].tc_variable");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,variable_type);
      std::__cxx11::stringstream::str();
      poVar2 = std::operator<<(poVar2,local_3e8);
      poVar2 = std::operator<<(poVar2," = in_data[0].vs_variable");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,variable_type);
      std::__cxx11::stringstream::str();
      poVar2 = std::operator<<(poVar2,local_408);
      poVar2 = std::operator<<(poVar2," + ");
      poVar2 = std::operator<<(poVar2,(string *)local_238);
      std::operator<<(poVar2,"(");
      std::__cxx11::string::~string(local_408);
      std::__cxx11::string::~string(local_3e8);
      for (local_40c = 0; local_40c < (uint)variable_type_string.field_2._12_4_;
          local_40c = local_40c + 1) {
        std::ostream::operator<<(&local_198,variable_array_size);
        if (local_40c != variable_type_string.field_2._12_4_ - 1) {
          std::operator<<(&local_198,", ");
        }
        variable_array_size = variable_array_size + 1;
      }
      std::operator<<(&local_198,");\n");
      std::__cxx11::stringstream::~stringstream(local_3c8);
    }
    std::__cxx11::string::~string((string *)local_238);
  }
  std::operator<<(&local_198,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getTessellationControlShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "layout (vertices=4) out;\n"

					  /* Declare input block */
					  "in VS_DATA\n"
					  "{\n"
				   << getVariableDeclarations("vs", variables) << "} in_data[];\n"

																  /* Declare output block */
																  "out TC_DATA\n"
																  "{\n"
				   << getVariableDeclarations("tc", variables) << "} out_data[];\n"
																  "\n"

																  /* Define main() */
																  "void main()\n"
																  "{\n"
																  "    gl_TessLevelInner[0] = 1;\n"
																  "    gl_TessLevelInner[1] = 1;\n"
																  "    gl_TessLevelOuter[0] = 1;\n"
																  "    gl_TessLevelOuter[1] = 1;\n"
																  "    gl_TessLevelOuter[2] = 1;\n"
																  "    gl_TessLevelOuter[3] = 1;\n"
																  "\n";

	/* Take input variables, add a predefined value and forward them to output variables */
	const size_t n_variables = variables.size();
	unsigned int counter	 = 2;

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			result_sstream << "out_data[gl_InvocationID].tc_variable" << n_variable << array_index_sstream.str()
						   << " = in_data[0].vs_variable" << n_variable << array_index_sstream.str() << " + "
						   << variable_type_string << "(";

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				result_sstream << (counter++);

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}
			}

			result_sstream << ");\n";
		} /* for (all array indices) */
	}	 /* for (all variable types) */

	result_sstream << "}\n";

	/* We're done */
	return result_sstream.str();
}